

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  NameContext *pNC;
  Parse *pParse;
  sqlite3 *psVar6;
  SrcList *pSVar7;
  IdList *pIVar8;
  ExprList *pEList;
  Schema *pSVar9;
  u8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  FuncDef *pFunc;
  Expr *pEVar16;
  RenameToken *pRVar17;
  Column *pCVar18;
  Select *pSVar19;
  Schema **ppSVar20;
  Table *pTVar21;
  ynVar yVar22;
  ushort uVar23;
  int iVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  char *pcVar28;
  uint uVar29;
  uint uVar30;
  ExprList_item *pEVar31;
  Expr *pEVar32;
  SrcList_item *pSVar33;
  long lVar34;
  int iVar35;
  ulong uVar36;
  char *zTab;
  ulong uVar37;
  NameContext *pNVar38;
  char **ppcVar39;
  uint uVar40;
  long lVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  Walker w;
  SrcList_item *local_e8;
  uint local_c8;
  NameContext *local_c0;
  Schema *local_b0;
  Table **local_a0;
  SrcList *local_78;
  undefined8 local_70;
  anon_union_8_3_c79b3df9_for_y *local_68;
  Walker local_60;
  
  pNC = (pWalker->u).pNC;
  pParse = pNC->pParse;
  bVar2 = pExpr->op;
  if (0x82 < bVar2) {
    if (bVar2 < 0x94) {
      if (bVar2 != 0x83) {
        if (bVar2 == 0x86) {
          pEVar32 = pExpr->pLeft;
          notValid(pParse,pNC,"the \".\" operator",0x20);
          pEVar16 = pExpr->pRight;
          if (pEVar16->op == ';') {
            pcVar28 = (char *)0x0;
          }
          else {
            pcVar28 = (pEVar32->u).zToken;
            pEVar32 = pEVar16->pLeft;
            pEVar16 = pEVar16->pRight;
          }
          zTab = (pEVar32->u).zToken;
          pcVar26 = (pEVar16->u).zToken;
          if (1 < pParse->eParseMode) {
            for (pRVar17 = pParse->pRename; pRVar17 != (RenameToken *)0x0; pRVar17 = pRVar17->pNext)
            {
              if ((Expr *)pRVar17->p == pEVar16) {
                pRVar17->p = pExpr;
                break;
              }
            }
            pRVar17 = pParse->pRename;
            if (pRVar17 != (RenameToken *)0x0) {
              do {
                if ((Expr *)pRVar17->p == pEVar32) {
                  pRVar17->p = &pExpr->y;
                  break;
                }
                pRVar17 = pRVar17->pNext;
              } while (pRVar17 != (RenameToken *)0x0);
            }
          }
          goto LAB_0019a60e;
        }
        goto switchD_0019a1ef_caseD_2e;
      }
      goto switchD_0019a1ef_caseD_31;
    }
    if (bVar2 == 0x94) {
      notValid(pParse,pNC,"parameters",0x26);
      goto switchD_0019a1ef_caseD_2e;
    }
    if (bVar2 == 0xa0) goto switchD_0019a1ef_caseD_2d;
    if (bVar2 != 0xa1) goto switchD_0019a1ef_caseD_2e;
    pSVar19 = (pExpr->x).pSelect;
    uVar36 = 0;
    iVar11 = 0;
    if (pSVar19 != (Select *)0x0) {
      iVar11 = *(int *)&pSVar19->pEList;
    }
    psVar6 = pParse->db;
    uVar10 = psVar6->enc;
    local_c8 = pNC->ncFlags;
    pcVar28 = (pExpr->u).zToken;
    if (pcVar28 != (char *)0x0) {
      sVar15 = strlen(pcVar28);
      uVar36 = (ulong)((uint)sVar15 & 0x3fffffff);
    }
    pFunc = sqlite3FindFunction(psVar6,pcVar28,iVar11,uVar10,'\0');
    if (pFunc == (FuncDef *)0x0) {
      bVar43 = false;
      pFunc = sqlite3FindFunction(pParse->db,pcVar28,-2,uVar10,'\0');
      bVar44 = pFunc == (FuncDef *)0x0;
      bVar42 = !bVar44;
    }
    else {
      bVar43 = pFunc->xFinalize != (_func_void_sqlite3_context_ptr *)0x0;
      if ((pFunc->funcFlags & 0x400) != 0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 2);
        *pbVar1 = *pbVar1 | 4;
        if (iVar11 == 2) {
          iVar11 = exprProbability((Expr *)pSVar19->pSrc);
          pExpr->iTable = iVar11;
          if (iVar11 < 0) {
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNC->nErr = pNC->nErr + 1;
          }
        }
        else {
          iVar11 = 0x7800000;
          if (*pFunc->zName == 'u') {
            iVar11 = 0x800000;
          }
          pExpr->iTable = iVar11;
        }
      }
      iVar11 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFunc->zName,(char *)0x0);
      if (iVar11 != 0) {
        if (iVar11 == 1) {
          sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFunc->zName);
          pNC->nErr = pNC->nErr + 1;
        }
        pExpr->op = 'r';
        return 1;
      }
      uVar40 = pFunc->funcFlags;
      if ((uVar40 & 0x2800) != 0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 2);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((uVar40 >> 0xb & 1) == 0) {
        notValid(pParse,pNC,"non-deterministic functions",0x22);
      }
      bVar44 = true;
      if ((pFunc->funcFlags & 0x40000) == 0) {
        bVar42 = true;
      }
      else {
        bVar45 = pParse->nested != '\0';
        bVar42 = sqlite3Config.bInternalFunctions != 0 || bVar45;
        if (sqlite3Config.bInternalFunctions == 0 && !bVar45) {
          pFunc = (FuncDef *)0x0;
        }
      }
    }
    if (1 < pParse->eParseMode) goto LAB_0019b3fa;
    if (((pFunc != (FuncDef *)0x0) && (pFunc->xValue == (_func_void_sqlite3_context_ptr *)0x0)) &&
       ((pExpr->flags & 0x1000000) != 0)) {
      pcVar26 = "%.*s() may not be used as a window function";
      goto LAB_0019b3b8;
    }
    if ((bVar43) &&
       (((pNC->ncFlags & 1U) == 0 ||
        ((bVar43 &&
         ((((pFunc->funcFlags & 0x10000) != 0 && ((pExpr->y).pTab == (Table *)0x0)) ||
          ((bVar43 && ((((uint)pNC->ncFlags >> 0xe & 1) == 0 && ((pExpr->y).pTab != (Table *)0x0))))
          )))))))) {
      if ((pFunc->funcFlags & 0x10000) == 0) {
        pcVar26 = "window";
        if ((pExpr->y).pTab == (Table *)0x0) {
          pcVar26 = "aggregate";
        }
      }
      else {
        pcVar26 = "window";
      }
      bVar43 = false;
      sqlite3ErrorMsg(pParse,"misuse of %s function %.*s()",pcVar26,uVar36,pcVar28);
LAB_0019b3cc:
      pNC->nErr = pNC->nErr + 1;
    }
    else {
      if ((!bVar42) && ((pParse->db->init).busy == '\0')) {
        pcVar26 = "no such function: %.*s";
LAB_0019b3b8:
        sqlite3ErrorMsg(pParse,pcVar26,uVar36,pcVar28);
        goto LAB_0019b3cc;
      }
      if (!bVar44) {
        pcVar26 = "wrong number of arguments to function %.*s()";
        goto LAB_0019b3b8;
      }
    }
    if (bVar43) {
      pNC->ncFlags = pNC->ncFlags & -(uint)((pExpr->y).pTab == (Table *)0x0) - 0x4001;
      bVar43 = true;
    }
    else {
      bVar43 = false;
    }
LAB_0019b3fa:
    sqlite3WalkExprList(pWalker,(ExprList *)pSVar19);
    if (!bVar43) {
      return 1;
    }
    local_c8 = local_c8 & 0x4001;
    if ((pExpr->y).pWin == (Window *)0x0) {
      pExpr->op = 0xa3;
      pExpr->op2 = '\0';
      pNVar38 = pNC;
      do {
        local_78 = pNVar38->pSrcList;
        local_60.xExprCallback = exprSrcCount;
        local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_70 = 0;
        local_60.u.pNC = (NameContext *)&local_78;
        sqlite3WalkExprList(&local_60,(pExpr->x).pList);
        if ((0 < (int)local_70) || (local_70._4_4_ == 0)) {
          pNVar38->ncFlags = pFunc->funcFlags & 0x1000 | pNVar38->ncFlags | 0x10;
          break;
        }
        pExpr->op2 = pExpr->op2 + '\x01';
        pNVar38 = pNVar38->pNext;
      } while (pNVar38 != (NameContext *)0x0);
    }
    else {
      pSVar19 = pNC->pWinSelect;
      if (pParse->eParseMode < 2) {
        sqlite3WindowUpdate(pParse,pSVar19->pWinDefn,(pExpr->y).pWin,pFunc);
      }
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pPartition);
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pOrderBy);
      pEVar32 = ((pExpr->y).pWin)->pFilter;
      if (pEVar32 != (Expr *)0x0) {
        walkExpr(pWalker,pEVar32);
      }
      if ((pSVar19->pWin == (Window *)0x0) ||
         (iVar11 = sqlite3WindowCompare(pParse,pSVar19->pWin,(pExpr->y).pWin), iVar11 == 0)) {
        ((pExpr->y).pWin)->pNextWin = pSVar19->pWin;
        pSVar19->pWin = (Window *)pExpr->y;
      }
      pbVar1 = (byte *)((long)&pNC->ncFlags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    pNC->ncFlags = pNC->ncFlags | local_c8;
    return 1;
  }
  switch(bVar2) {
  case 0x2d:
    goto switchD_0019a1ef_caseD_2d;
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x3a:
    goto switchD_0019a1ef_caseD_2e;
  case 0x30:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_0019a1ef_caseD_30;
  case 0x31:
    goto switchD_0019a1ef_caseD_31;
  case 0x3b:
    pcVar26 = (pExpr->u).zToken;
    pcVar28 = (char *)0x0;
    zTab = (char *)0x0;
LAB_0019a60e:
    psVar6 = pParse->db;
    pExpr->iTable = -1;
    iVar11 = 0;
    if ((pcVar28 == (char *)0x0) || ((pNC->ncFlags & 6) != 0)) {
      local_b0 = (Schema *)0x0;
      pcVar28 = (char *)0x0;
    }
    else {
      if (0 < (long)psVar6->nDb) {
        local_b0 = (Schema *)0x0;
        lVar41 = 0;
LAB_0019af96:
        lVar34 = 0;
        do {
          bVar2 = psVar6->aDb[lVar41].zDbSName[lVar34];
          bVar3 = pcVar28[lVar34];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_0019afc9;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_0019afc9;
          lVar34 = lVar34 + 1;
        } while( true );
      }
      local_b0 = (Schema *)0x0;
    }
LAB_0019a64b:
    local_68 = &pExpr->y;
    local_a0 = &pParse->pTriggerTab;
    uVar10 = 0xa2;
    local_e8 = (SrcList_item *)0x0;
    iVar13 = 0;
    iVar35 = 0;
    local_c0 = pNC;
LAB_0019a6ab:
    pSVar7 = local_c0->pSrcList;
    if (pSVar7 != (SrcList *)0x0) {
      iVar14 = pSVar7->nSrc;
      if (0 < iVar14) {
        pSVar33 = pSVar7->a;
        iVar24 = 0;
LAB_0019a6d4:
        pTVar21 = pSVar33->pTab;
        pSVar19 = pSVar33->pSelect;
        if ((pSVar19 == (Select *)0x0) || ((pSVar19->selFlags & 0x800) == 0)) {
LAB_0019a7a1:
          if ((pcVar28 != (char *)0x0) && (pTVar21->pSchema != local_b0)) goto LAB_0019a979;
          if (zTab != (char *)0x0) {
            pcVar27 = pSVar33->zAlias;
            pcVar25 = pcVar27;
            if (pcVar27 == (char *)0x0) {
              pcVar25 = pTVar21->zName;
            }
            lVar41 = 0;
            do {
              bVar2 = pcVar25[lVar41];
              bVar3 = zTab[lVar41];
              if (bVar2 == bVar3) {
                if ((ulong)bVar2 == 0) goto LAB_0019a7fe;
              }
              else if (""[bVar2] != ""[bVar3]) goto LAB_0019a7fe;
              lVar41 = lVar41 + 1;
            } while( true );
          }
          goto LAB_0019a84c;
        }
        lVar41 = (long)pSVar19->pEList->nExpr;
        bVar42 = false;
        if (lVar41 < 1) {
          bVar42 = false;
        }
        else {
          ppcVar39 = &pSVar19->pEList->a[0].zSpan;
          lVar34 = 0;
          do {
            iVar12 = sqlite3MatchSpanName(*ppcVar39,pcVar26,zTab,pcVar28);
            if (iVar12 != 0) {
              iVar35 = iVar35 + 1;
              pExpr->iColumn = (ynVar)lVar34;
              iVar13 = 2;
              bVar42 = true;
              local_e8 = pSVar33;
            }
            lVar34 = lVar34 + 1;
            ppcVar39 = ppcVar39 + 4;
          } while (lVar41 != lVar34);
        }
        if (zTab != (char *)0x0 && !bVar42) goto LAB_0019a7a1;
        goto LAB_0019a979;
      }
LAB_0019a999:
      if (local_e8 == (SrcList_item *)0x0) {
        local_e8 = (SrcList_item *)0x0;
      }
      else {
        pExpr->iTable = local_e8->iCursor;
        pTVar21 = local_e8->pTab;
        (pExpr->y).pTab = pTVar21;
        if (((local_e8->fg).jointype & 8) != 0) {
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 0x10;
        }
        local_b0 = pTVar21->pSchema;
      }
    }
    if (iVar13 == 0 && (zTab != (char *)0x0 && pcVar28 == (char *)0x0)) {
      pTVar21 = *local_a0;
      if (pTVar21 != (Table *)0x0) {
        if (pParse->eTriggerOp != 'y') {
          lVar41 = 0;
          do {
            bVar2 = "new"[lVar41];
            bVar3 = zTab[lVar41];
            if (bVar2 == bVar3) {
              if ((ulong)bVar2 == 0) goto LAB_0019aa6e;
            }
            else if (""[bVar2] != ""[bVar3]) goto LAB_0019aa6e;
            lVar41 = lVar41 + 1;
          } while( true );
        }
        goto LAB_0019aa05;
      }
      goto LAB_0019aa85;
    }
    goto LAB_0019ac3a;
  default:
    if (bVar2 != 0x14) goto switchD_0019a1ef_caseD_2e;
    goto switchD_0019a1ef_caseD_31;
  }
LAB_0019afc9:
  if (bVar2 == bVar3) {
    local_b0 = psVar6->aDb[lVar41].pSchema;
    goto LAB_0019a64b;
  }
  lVar41 = lVar41 + 1;
  if (lVar41 == psVar6->nDb) goto LAB_0019a64b;
  goto LAB_0019af96;
LAB_0019a7fe:
  if (bVar2 == bVar3) {
    if ((pcVar27 != (char *)0x0) && (1 < pParse->eParseMode)) {
      for (pRVar17 = pParse->pRename; pRVar17 != (RenameToken *)0x0; pRVar17 = pRVar17->pNext) {
        if ((anon_union_8_3_c79b3df9_for_y *)pRVar17->p == local_68) {
          pRVar17->p = (void *)0x0;
          break;
        }
      }
    }
LAB_0019a84c:
    iVar12 = iVar13 + 1;
    if (iVar13 == 0) {
      local_e8 = pSVar33;
    }
    iVar13 = iVar12;
    if (0 < pTVar21->nCol) {
      pCVar18 = pTVar21->aCol;
      iVar12 = 0;
LAB_0019a87c:
      lVar41 = 0;
      do {
        bVar2 = pCVar18->zName[lVar41];
        bVar3 = pcVar26[lVar41];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_0019a8a7;
        }
        else if (""[bVar2] != ""[bVar3]) goto LAB_0019a8a7;
        lVar41 = lVar41 + 1;
      } while( true );
    }
  }
LAB_0019a979:
  iVar24 = iVar24 + 1;
  pSVar33 = pSVar33 + 1;
  if (iVar24 == iVar14) goto LAB_0019a999;
  goto LAB_0019a6d4;
LAB_0019a8a7:
  if (bVar2 == bVar3) {
    if (iVar35 == 1) {
      if (((pSVar33->fg).jointype & 4) != 0) goto LAB_0019a927;
      pIVar8 = pSVar33->pUsing;
      if ((pIVar8 != (IdList *)0x0) && (uVar36 = (ulong)pIVar8->nId, 0 < (long)uVar36)) {
        bVar42 = true;
        uVar37 = 0;
LAB_0019a8db:
        lVar41 = 0;
        do {
          bVar2 = pIVar8->a[uVar37].zName[lVar41];
          bVar3 = pcVar26[lVar41];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_0019a90e;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_0019a90e;
          lVar41 = lVar41 + 1;
        } while( true );
      }
    }
LAB_0019a940:
    iVar35 = iVar35 + 1;
    yVar22 = (ynVar)iVar12;
    if (iVar12 == pTVar21->iPKey) {
      yVar22 = -1;
    }
    pExpr->iColumn = yVar22;
    local_e8 = pSVar33;
    goto LAB_0019a979;
  }
  goto LAB_0019a927;
LAB_0019a90e:
  if (bVar2 == bVar3) goto LAB_0019a921;
  uVar37 = uVar37 + 1;
  bVar42 = uVar37 < uVar36;
  if (uVar37 == uVar36) goto LAB_0019a940;
  goto LAB_0019a8db;
LAB_0019a921:
  if (!bVar42) goto LAB_0019a940;
LAB_0019a927:
  iVar12 = iVar12 + 1;
  pCVar18 = pCVar18 + 1;
  if (iVar12 == pTVar21->nCol) goto LAB_0019a979;
  goto LAB_0019a87c;
LAB_0019aa6e:
  iVar13 = 1;
  if (bVar2 == bVar3) goto LAB_0019aa78;
  if (pParse->eTriggerOp != 'x') {
LAB_0019aa05:
    lVar41 = 0;
    do {
      bVar2 = "wrong number of arguments to function fts5_fold"[lVar41 + 0x2c];
      bVar3 = zTab[lVar41];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_0019aa39;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_0019aa39;
      lVar41 = lVar41 + 1;
    } while( true );
  }
LAB_0019aa85:
  pTVar21 = (Table *)0x0;
  goto LAB_0019aa88;
LAB_0019aa39:
  iVar13 = 0;
  if (bVar2 != bVar3) goto LAB_0019aa85;
LAB_0019aa78:
  pExpr->iTable = iVar13;
LAB_0019aa88:
  if (((local_c0->ncFlags & 0x200) != 0) && ((local_c0->uNC).pUpsert != (Upsert *)0x0)) {
    lVar41 = 0;
    do {
      bVar2 = "excluded"[lVar41];
      bVar3 = zTab[lVar41];
      if (bVar2 == bVar3) {
        if ((ulong)bVar2 == 0) goto LAB_0019aac9;
      }
      else if (""[bVar2] != ""[bVar3]) goto LAB_0019aac9;
      lVar41 = lVar41 + 1;
    } while( true );
  }
LAB_0019aae1:
  if (pTVar21 == (Table *)0x0) {
    iVar13 = 0;
  }
  else {
    uVar40 = (uint)pTVar21->nCol;
    if (0 < pTVar21->nCol) {
      pCVar18 = pTVar21->aCol;
      uVar29 = 0;
LAB_0019aaf6:
      lVar41 = 0;
      do {
        bVar2 = pCVar18->zName[lVar41];
        bVar3 = pcVar26[lVar41];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_0019ab1f;
        }
        else if (""[bVar2] != ""[bVar3]) goto LAB_0019ab1f;
        lVar41 = lVar41 + 1;
      } while( true );
    }
    uVar30 = 0;
LAB_0019ab4f:
    local_b0 = pTVar21->pSchema;
    if (((int)uVar40 <= (int)uVar30) && (iVar13 = sqlite3IsRowid(pcVar26), iVar13 != 0)) {
      uVar30 = uVar30 | -(uint)((pTVar21->tabFlags & 0x40) == 0);
    }
    if ((int)uVar30 < (int)uVar40) {
      iVar35 = iVar35 + 1;
      if (pExpr->iTable == 2) {
        if (pParse->eParseMode < 2) {
          pExpr->iTable = uVar30 + ((local_c0->uNC).pUpsert)->regData;
          pbVar1 = (byte *)((long)&pExpr->flags + 2);
          *pbVar1 = *pbVar1 | 0x40;
          uVar10 = 0xa8;
        }
        else {
          pExpr->iColumn = (ynVar)uVar30;
          (pExpr->y).pTab = pTVar21;
          uVar10 = 0xa2;
        }
      }
      else {
        if ((int)uVar30 < 0) {
          pExpr->affinity = 'D';
        }
        else {
          uVar40 = 1 << ((byte)uVar30 & 0x1f);
          if (0x1f < (int)uVar30) {
            uVar40 = 0xffffffff;
          }
          if (pExpr->iTable == 0) {
            pParse->oldmask = pParse->oldmask | uVar40;
          }
          else {
            pParse->newmask = pParse->newmask | uVar40;
          }
        }
        (pExpr->y).pTab = pTVar21;
        pExpr->iColumn = (ynVar)uVar30;
        uVar10 = 'M';
      }
    }
    iVar13 = 1;
  }
LAB_0019ac3a:
  if (((((iVar35 == 0) && (iVar13 == 1)) && (local_e8 != (SrcList_item *)0x0)) &&
      ((iVar35 = 0, (local_c0->ncFlags & 0x20) == 0 &&
       (iVar14 = sqlite3IsRowid(pcVar26), iVar14 != 0)))) &&
     ((local_e8->pTab->tabFlags & 0x40) == 0)) {
    pExpr->iColumn = -1;
    pExpr->affinity = 'D';
    iVar35 = 1;
  }
  if (((zTab == (char *)0x0) && (iVar35 == 0)) && ((local_c0->ncFlags & 0x80U) != 0)) {
    pEList = (local_c0->uNC).pEList;
    if (0 < pEList->nExpr) {
      lVar41 = 0;
      iVar35 = 0;
LAB_0019acf6:
      pcVar27 = pEList->a[lVar41].zName;
      bVar42 = true;
      if (pcVar27 != (char *)0x0) {
        lVar34 = 0;
        do {
          bVar2 = pcVar27[lVar34];
          bVar3 = pcVar26[lVar34];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_0019ad33;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_0019ad33;
          lVar34 = lVar34 + 1;
        } while( true );
      }
      goto LAB_0019ad7e;
    }
    iVar35 = 0;
  }
LAB_0019aeb0:
  iVar14 = 5;
  if (iVar35 == 0) {
    local_c0 = local_c0->pNext;
    iVar11 = iVar11 + 1;
    iVar14 = 0;
    iVar35 = 0;
  }
LAB_0019aee0:
  if (iVar14 != 0) {
    if (iVar14 != 5) {
      if (iVar14 != 0x16) {
        return 2;
      }
      goto LAB_0019b2e1;
    }
    goto LAB_0019af16;
  }
  if (local_c0 == (NameContext *)0x0) goto LAB_0019af16;
  goto LAB_0019a6ab;
LAB_0019aac9:
  if (bVar2 == bVar3) {
    pTVar21 = ((local_c0->uNC).pUpsert)->pUpsertSrc->a[0].pTab;
    pExpr->iTable = 2;
  }
  goto LAB_0019aae1;
LAB_0019ab1f:
  if (bVar2 == bVar3) {
    uVar30 = uVar29;
    if (uVar29 == (int)pTVar21->iPKey) {
      uVar30 = 0xffffffff;
    }
    goto LAB_0019ab4f;
  }
  uVar29 = uVar29 + 1;
  pCVar18 = pCVar18 + 1;
  uVar30 = uVar40;
  if (uVar29 == uVar40) goto LAB_0019ab4f;
  goto LAB_0019aaf6;
LAB_0019ad33:
  if (bVar2 != bVar3) {
LAB_0019ad7e:
    iVar14 = 0;
    goto LAB_0019ad80;
  }
  pEVar32 = pEList->a[lVar41].pExpr;
  if (((local_c0->ncFlags & 1U) == 0) && ((pEVar32->flags & 0x10) != 0)) {
    pcVar27 = "misuse of aliased aggregate %s";
  }
  else {
    if ((((uint)local_c0->ncFlags >> 0xe & 1) != 0) || ((pEVar32->flags & 0x8000) == 0)) {
      uVar4 = pEVar32->op;
      if (uVar4 == 0xa8) {
        uVar4 = pEVar32->op2;
      }
      if (uVar4 == 0x83) {
        pSVar19 = (pEVar32->x).pSelect;
LAB_0019adb6:
        if (((anon_union_8_2_a01b6dbf_for_x *)&pSVar19->pEList)->pList->nExpr == 1)
        goto LAB_0019adbe;
        sqlite3ErrorMsg(pParse,"row value misused");
        iVar14 = 1;
      }
      else {
        if (uVar4 == 0xa9) {
          pSVar19 = (Select *)&pEVar32->x;
          goto LAB_0019adb6;
        }
LAB_0019adbe:
        resolveAlias(pParse,pEList,(int)lVar41,pExpr,"",iVar11);
        iVar35 = 1;
        iVar14 = 0x16;
        if (1 < pParse->eParseMode) {
          for (pRVar17 = pParse->pRename; pRVar17 != (RenameToken *)0x0; pRVar17 = pRVar17->pNext) {
            if ((Expr *)pRVar17->p == pExpr) {
              pRVar17->p = (void *)0x0;
              break;
            }
          }
          local_e8 = (SrcList_item *)0x0;
          bVar42 = false;
          goto LAB_0019ad80;
        }
        local_e8 = (SrcList_item *)0x0;
      }
      bVar42 = false;
      goto LAB_0019ad80;
    }
    pcVar27 = "misuse of aliased window function %s";
  }
  bVar42 = false;
  sqlite3ErrorMsg(pParse,pcVar27);
  iVar14 = 1;
LAB_0019ad80:
  if (!bVar42) goto LAB_0019aee0;
  lVar41 = lVar41 + 1;
  if (pEList->nExpr <= lVar41) goto LAB_0019aeb0;
  goto LAB_0019acf6;
switchD_0019a1ef_caseD_31:
  if ((pExpr->flags & 0x800) != 0) {
    iVar11 = pNC->nRef;
    notValid(pParse,pNC,"subqueries",0x26);
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar11 != pNC->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
      *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 0x40;
    }
  }
  goto switchD_0019a1ef_caseD_2e;
LAB_0019af16:
  if ((zTab != (char *)0x0) || (iVar35 != 0)) goto LAB_0019b1f3;
  if ((pExpr->flags & 0x40) != 0) {
    uVar40 = 1;
    if ((psVar6->init).busy == '\0') {
      if ((pNC->ncFlags & 0x10000) == 0) {
        uVar40 = (uint)(psVar6->flags >> 0x1e) & 3;
      }
      else {
        uVar29 = (uint)psVar6->flags;
        if ((uVar29 & 0x50000001) == 0x40000001) goto LAB_0019b1a0;
        uVar40 = uVar29 >> 0x1d;
      }
      uVar40 = uVar40 & 1;
    }
LAB_0019b1a0:
    if (uVar40 != 0) {
      sqlite3_log(0x1c,"double-quoted string literal: \"%w\"",pcVar26);
      pExpr->op = 'n';
      (pExpr->y).pTab = (Table *)0x0;
      return 1;
    }
  }
  iVar11 = sqlite3ExprIdToTrueFalse(pExpr);
  if (iVar11 != 0) {
    return 1;
  }
LAB_0019b1f3:
  if (iVar35 != 1) {
    pcVar27 = "ambiguous column name";
    if (iVar35 == 0) {
      pcVar27 = "no such column";
    }
    if (pcVar28 == (char *)0x0) {
      if (zTab == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar27,pcVar26);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar27,zTab,pcVar26);
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar27,pcVar28,zTab,pcVar26);
    }
    pParse->checkSchema = '\x01';
    pNC->nErr = pNC->nErr + 1;
  }
  uVar5 = pExpr->iColumn;
  if ((-1 < (short)uVar5) && (local_e8 != (SrcList_item *)0x0)) {
    uVar23 = 0x3f;
    if (uVar5 < 0x3f) {
      uVar23 = uVar5;
    }
    local_e8->colUsed = local_e8->colUsed | 1L << ((byte)uVar23 & 0x3f);
  }
  if (pExpr->pLeft != (Expr *)0x0) {
    sqlite3ExprDeleteNN(psVar6,pExpr->pLeft);
  }
  pExpr->pLeft = (Expr *)0x0;
  if (pExpr->pRight != (Expr *)0x0) {
    sqlite3ExprDeleteNN(psVar6,pExpr->pRight);
  }
  pExpr->pRight = (Expr *)0x0;
  pExpr->op = uVar10;
  pbVar1 = (byte *)((long)&pExpr->flags + 2);
  *pbVar1 = *pbVar1 | 0x80;
LAB_0019b2e1:
  if (iVar35 != 1) {
    return 2;
  }
  if (((pExpr->flags & 0x400000) == 0) && (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
    if (local_b0 == (Schema *)0x0) {
      iVar11 = -1000000;
    }
    else {
      iVar11 = -1;
      ppSVar20 = &pParse->db->aDb->pSchema;
      do {
        iVar11 = iVar11 + 1;
        pSVar9 = *ppSVar20;
        ppSVar20 = ppSVar20 + 4;
      } while (pSVar9 != local_b0);
    }
    if (-1 < iVar11) {
      if (pExpr->op == 'M') {
LAB_0019b583:
        pTVar21 = *local_a0;
      }
      else {
        lVar41 = (long)local_c0->pSrcList->nSrc;
        if (lVar41 < 1) {
          pTVar21 = (Table *)0x0;
        }
        else {
          local_a0 = &local_c0->pSrcList->a[0].pTab;
          pTVar21 = (Table *)0x0;
          do {
            if (pExpr->iTable == *(int *)(local_a0 + 4)) goto LAB_0019b583;
            local_a0 = local_a0 + 0xe;
            lVar41 = lVar41 + -1;
          } while (lVar41 != 0);
        }
      }
      if (pTVar21 != (Table *)0x0) {
        lVar41 = (long)pExpr->iColumn;
        if ((pExpr->iColumn < 0) && (lVar41 = (long)pTVar21->iPKey, lVar41 < 0)) {
          pcVar28 = "ROWID";
        }
        else {
          pcVar28 = pTVar21->aCol[lVar41].zName;
        }
        iVar11 = sqlite3AuthReadCol(pParse,pTVar21->zName,pcVar28,iVar11);
        if (iVar11 == 2) {
          pExpr->op = 'r';
        }
      }
    }
  }
  pNC->nRef = pNC->nRef + 1;
  while (local_c0 != pNC) {
    pNC = pNC->pNext;
    pNC->nRef = pNC->nRef + 1;
  }
  return 1;
switchD_0019a1ef_caseD_2d:
  pEVar32 = pExpr->pRight;
  while ((pEVar32 != (Expr *)0x0 && ((pEVar32->flags & 0x41000) != 0))) {
    if ((pEVar32->flags >> 0x12 & 1) == 0) {
      pEVar31 = (ExprList_item *)&pEVar32->pLeft;
    }
    else {
      pEVar31 = ((pEVar32->x).pList)->a;
    }
    pEVar32 = pEVar31->pExpr;
  }
  bVar42 = true;
  if (pEVar32->op == ';') {
    iVar11 = resolveExprStep(pWalker,pEVar32);
    if (iVar11 == 2) {
      pEVar32 = (Expr *)0x2;
      bVar42 = false;
    }
    else if (pEVar32->op == 0x9f) {
      pExpr->op2 = pExpr->op;
      pExpr->op = 0xa7;
      bVar42 = false;
      pEVar32 = (Expr *)0x0;
    }
  }
  if (!bVar42) {
    return (int)pEVar32;
  }
switchD_0019a1ef_caseD_30:
  if (pParse->db->mallocFailed != '\0') goto switchD_0019a1ef_caseD_2e;
  pEVar32 = pExpr->pLeft;
  uVar10 = pEVar32->op;
  if (uVar10 == 0xa8) {
    uVar10 = pEVar32->op2;
  }
  if (uVar10 == 0x83) {
    pSVar19 = (pEVar32->x).pSelect;
LAB_0019a475:
    iVar11 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar19->pEList)->pList->nExpr;
  }
  else {
    iVar11 = 1;
    if (uVar10 == 0xa9) {
      pSVar19 = (Select *)&pEVar32->x;
      goto LAB_0019a475;
    }
  }
  if (pExpr->op == '0') {
    pEVar32 = ((pExpr->x).pList)->a[0].pExpr;
    uVar10 = pEVar32->op;
    if (uVar10 == 0xa8) {
      uVar10 = pEVar32->op2;
    }
    if (uVar10 == 0x83) {
      pSVar19 = (pEVar32->x).pSelect;
LAB_0019a4e4:
      iVar35 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar19->pEList)->pList->nExpr;
    }
    else {
      iVar35 = 1;
      if (uVar10 == 0xa9) {
        pSVar19 = (Select *)&pEVar32->x;
        goto LAB_0019a4e4;
      }
    }
    if (iVar35 == iVar11) {
      pEVar32 = *(Expr **)((pExpr->x).pList + 1);
      goto LAB_0019a4f1;
    }
  }
  else {
    pEVar32 = pExpr->pRight;
LAB_0019a4f1:
    uVar10 = pEVar32->op;
    if (uVar10 == 0xa8) {
      uVar10 = pEVar32->op2;
    }
    if (uVar10 == 0x83) {
      pSVar19 = (pEVar32->x).pSelect;
    }
    else {
      iVar35 = 1;
      if (uVar10 != 0xa9) goto LAB_0019a51f;
      pSVar19 = (Select *)&pEVar32->x;
    }
    iVar35 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar19->pEList)->pList->nExpr;
  }
LAB_0019a51f:
  if (iVar11 != iVar35) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
switchD_0019a1ef_caseD_2e:
  iVar11 = 2;
  if (pParse->nErr == 0) {
    iVar11 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar11;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a;
      assert( HasRowid(pItem->pTab) && pItem->pTab->pSelect==0 );
      pExpr->op = TK_COLUMN;
      pExpr->y.pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        Expr *pLeft = pExpr->pLeft;
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pLeft->u.zToken;
          pLeft = pRight->pLeft;
          pRight = pRight->pRight;
        }
        zTable = pLeft->u.zToken;
        zColumn = pRight->u.zToken;
        if( IN_RENAME_OBJECT ){
          sqlite3RenameTokenRemap(pParse, (void*)pExpr, (void*)pRight);
          sqlite3RenameTokenRemap(pParse, (void*)&pExpr->y.pTab, (void*)pLeft);
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */
      int savedAllowFlags = (pNC->ncFlags & (NC_AllowAgg | NC_AllowWin));

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_INTERNAL)!=0
         && pParse->nested==0
         && sqlite3Config.bInternalFunctions==0
        ){
          /* Internal-use-only functions are disallowed unless the
          ** SQL is being compiled using sqlite3NestedParse() */
          no_such_func = 1;
          pDef = 0;
        }
      }

      if( 0==IN_RENAME_OBJECT ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        assert( is_agg==0 || (pDef->funcFlags & SQLITE_FUNC_MINMAX)
          || (pDef->xValue==0 && pDef->xInverse==0)
          || (pDef->xValue && pDef->xInverse && pDef->xSFunc && pDef->xFinalize)
        );
        if( pDef && pDef->xValue==0 && ExprHasProperty(pExpr, EP_WinFunc) ){
          sqlite3ErrorMsg(pParse, 
              "%.*s() may not be used as a window function", nId, zId
          );
          pNC->nErr++;
        }else if( 
              (is_agg && (pNC->ncFlags & NC_AllowAgg)==0)
           || (is_agg && (pDef->funcFlags&SQLITE_FUNC_WINDOW) && !pExpr->y.pWin)
           || (is_agg && pExpr->y.pWin && (pNC->ncFlags & NC_AllowWin)==0)
        ){
          const char *zType;
          if( (pDef->funcFlags & SQLITE_FUNC_WINDOW) || pExpr->y.pWin ){
            zType = "window";
          }else{
            zType = "aggregate";
          }
          sqlite3ErrorMsg(pParse, "misuse of %s function %.*s()",zType,nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#else
        if( (is_agg && (pNC->ncFlags & NC_AllowAgg)==0) ){
          sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#endif
        else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                  && pParse->explain==0
#endif
        ){
          sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
          pNC->nErr++;
        }else if( wrong_num_args ){
          sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
               nId, zId);
          pNC->nErr++;
        }
        if( is_agg ){
          /* Window functions may not be arguments of aggregate functions.
          ** Or arguments of other window functions. But aggregate functions
          ** may be arguments for window functions.  */
#ifndef SQLITE_OMIT_WINDOWFUNC
          pNC->ncFlags &= ~(NC_AllowWin | (!pExpr->y.pWin ? NC_AllowAgg : 0));
#else
          pNC->ncFlags &= ~NC_AllowAgg;
#endif
        }
      }
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( pExpr->y.pWin ){
          Select *pSel = pNC->pWinSelect;
          if( IN_RENAME_OBJECT==0 ){
            sqlite3WindowUpdate(pParse, pSel->pWinDefn, pExpr->y.pWin, pDef);
          }
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pPartition);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pOrderBy);
          sqlite3WalkExpr(pWalker, pExpr->y.pWin->pFilter);
          if( 0==pSel->pWin 
           || 0==sqlite3WindowCompare(pParse, pSel->pWin, pExpr->y.pWin) 
          ){
            pExpr->y.pWin->pNextWin = pSel->pWin;
            pSel->pWin = pExpr->y.pWin;
          }
          pNC->ncFlags |= NC_HasWin;
        }else
#endif /* SQLITE_OMIT_WINDOWFUNC */
        {
          NameContext *pNC2 = pNC;
          pExpr->op = TK_AGG_FUNCTION;
          pExpr->op2 = 0;
          while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
            pExpr->op2++;
            pNC2 = pNC2->pNext;
          }
          assert( pDef!=0 );
          if( pNC2 ){
            assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
            testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
            pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

          }
        }
        pNC->ncFlags |= savedAllowFlags;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
      assert( !ExprHasProperty(pExpr, EP_Reduced) );
      /* Handle special cases of "x IS TRUE", "x IS FALSE", "x IS NOT TRUE",
      ** and "x IS NOT FALSE". */
      if( pRight->op==TK_ID ){
        int rc = resolveExprStep(pWalker, pRight);
        if( rc==WRC_Abort ) return WRC_Abort;
        if( pRight->op==TK_TRUEFALSE ){
          pExpr->op2 = pExpr->op;
          pExpr->op = TK_TRUTH;
          return WRC_Continue;
        }
      }
      /* Fall thru */
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}